

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O0

void __thiscall TypesHierarchy::AddRelation(TypesHierarchy *this,TYPE_ID type,TYPE_ID parent)

{
  reference this_00;
  TYPE_ID local_14;
  TYPE_ID parent_local;
  TYPE_ID type_local;
  TypesHierarchy *this_local;
  
  local_14 = type;
  _parent_local = this;
  this_00 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[](&this->types,(ulong)parent);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_14);
  return;
}

Assistant:

void TypesHierarchy::AddRelation(TYPE_ID type, TYPE_ID parent) {
//	types[type].push_back(parent);
	types[parent].push_back(type);
}